

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O3

void __thiscall
QBluetoothPermission::setCommunicationModes(QBluetoothPermission *this,CommunicationModes modes)

{
  CommunicationMode CVar1;
  
  if ((QFlagsStorage<QBluetoothPermission::CommunicationMode>)
      modes.super_QFlagsStorageHelper<QBluetoothPermission::CommunicationMode,_4>.
      super_QFlagsStorage<QBluetoothPermission::CommunicationMode>.i ==
      (QFlagsStorage<QBluetoothPermission::CommunicationMode>)0x0) {
    QtPrivateLogging::lcPermissions();
    CVar1 = Default;
    if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledWarning._q_value.
               _M_base._M_i & 1) != 0) {
      setCommunicationModes();
    }
  }
  else {
    CVar1 = (CommunicationMode)
            modes.super_QFlagsStorageHelper<QBluetoothPermission::CommunicationMode,_4>.
            super_QFlagsStorage<QBluetoothPermission::CommunicationMode>.i;
  }
  (this->u).data.mode = CVar1;
  return;
}

Assistant:

void QBluetoothPermission::setCommunicationModes(CommunicationModes modes)
{
    if (modes == CommunicationModes{}) {
        qCWarning(lcPermissions, "QBluetoothPermission: trying to set an invalid empty mode. "
                                 "Falling back to CommunicationMode::Default.");
        u.data.mode = Default;
    } else {
        u.data.mode = static_cast<CommunicationMode>(modes.toInt());
    }
}